

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall FlowGraph::Dominates(FlowGraph *this,Region *region1,Region *region2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int local_38;
  int local_34;
  int region2Depth;
  int region1Depth;
  Region *startR2;
  Region *startR1;
  Region *region2_local;
  Region *region1_local;
  FlowGraph *this_local;
  
  if (region1 == (Region *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x3f,"(region1)","region1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (region2 == (Region *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x40,"(region2)","region2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_34 = 0;
  for (startR2 = region1; startR2 != (Region *)0x0; startR2 = Region::GetParent(startR2)) {
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  for (_region2Depth = region2; _region2Depth != (Region *)0x0;
      _region2Depth = Region::GetParent(_region2Depth)) {
    local_38 = local_38 + 1;
  }
  return local_38 < local_34;
}

Assistant:

bool FlowGraph::Dominates(Region *region1, Region *region2)
{
    Assert(region1);
    Assert(region2);
    Region *startR1 = region1;
    Region *startR2 = region2;
    int region1Depth = 0;
    while (startR1 != nullptr)
    {
        region1Depth++;
        startR1 = startR1->GetParent();
    }
    int region2Depth = 0;
    while (startR2 != nullptr)
    {
        region2Depth++;
        startR2 = startR2->GetParent();
    }
    return region1Depth > region2Depth;
}